

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void __thiscall libtorrent::session_proxy::~session_proxy(session_proxy *this)

{
  bool bVar1;
  long lVar2;
  session_proxy *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_thread);
  if ((bVar1) &&
     (lVar2 = std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::use_count
                        (&(this->m_thread).
                          super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>), lVar2 == 1))
  {
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &this->m_thread);
    std::thread::join();
  }
  std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr(&this->m_impl);
  std::shared_ptr<std::thread>::~shared_ptr(&this->m_thread);
  std::shared_ptr<boost::asio::io_context>::~shared_ptr(&this->m_io_service);
  return;
}

Assistant:

session_proxy::~session_proxy()
	{
		if (m_thread && m_thread.use_count() == 1)
		{
#if defined TORRENT_ASIO_DEBUGGING
			wait_for_asio_handlers();
#endif
			m_thread->join();
		}
	}